

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

void Gia_CreateHeader(FILE *pFile,int Type,int Size,uchar *pBuffer)

{
  int __fd;
  ssize_t sVar1;
  size_t __n;
  long lVar2;
  
  lVar2 = 0;
  fprintf((FILE *)pFile,"%.6d",Type);
  fputc(0x20,(FILE *)pFile);
  fprintf((FILE *)pFile,"%.16d",(ulong)(uint)Size);
  fputc(0x20,(FILE *)pFile);
  fflush((FILE *)pFile);
  __fd = fileno((FILE *)pFile);
  do {
    __n = Size - lVar2;
    if (__n == 0 || Size < lVar2) {
      return;
    }
    sVar1 = write(__fd,pBuffer + lVar2,__n);
    lVar2 = lVar2 + sVar1;
  } while (-1 < sVar1);
  fwrite("BridgeMode: failed to send package; aborting\n",0x2d,1,_stderr);
  fflush(_stderr);
  _exit(0xff);
}

Assistant:

void Gia_CreateHeader( FILE * pFile, int Type, int Size, unsigned char * pBuffer )
{
    fprintf( pFile, "%.6d", Type );
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", Size );
    fprintf( pFile, " " );
#if !defined(LIN) && !defined(LIN64)
    {
    int RetValue;
    RetValue = fwrite( pBuffer, Size, 1, pFile );
    assert( RetValue == 1 || Size == 0);
    fflush( pFile );
    }
#else
    fflush(pFile);
    int fd = fileno(pFile);

    ssize_t bytes_written = 0;
    while (bytes_written < Size){
        ssize_t n = write(fd, &pBuffer[bytes_written], Size - bytes_written);
        if (n < 0){
            fprintf(stderr, "BridgeMode: failed to send package; aborting\n"); fflush(stderr);
            _exit(255);
        }
        bytes_written += n;
    }
#endif
}